

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_disconnect(Curl_easy *data)

{
  MQTT *pMVar1;
  CURLcode CVar2;
  MQTT *mq;
  CURLcode result;
  Curl_easy *data_local;
  
  pMVar1 = (data->req).p.mqtt;
  CVar2 = mqtt_send(data,anon_var_dwarf_d384e,2);
  (*Curl_cfree)(pMVar1->sendleftovers);
  pMVar1->sendleftovers = (char *)0x0;
  Curl_dyn_free(&pMVar1->recvbuf);
  return CVar2;
}

Assistant:

static CURLcode mqtt_disconnect(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct MQTT *mq = data->req.p.mqtt;
  result = mqtt_send(data, (char *)"\xe0\x00", 2);
  Curl_safefree(mq->sendleftovers);
  Curl_dyn_free(&mq->recvbuf);
  return result;
}